

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall
curlpp::CallbackException<curlpp::UnknowException>::CallbackException
          (CallbackException<curlpp::UnknowException> *this,
          CallbackException<curlpp::UnknowException> *param_2)

{
  CallbackExceptionBase *in_RSI;
  CallbackExceptionBase *in_RDI;
  
  CallbackExceptionBase::CallbackExceptionBase(in_RSI,in_RDI);
  *(undefined ***)&((UnknowException *)in_RDI)->super_RuntimeError =
       &PTR__CallbackException_00162ce8;
  UnknowException::UnknowException((UnknowException *)in_RSI,(UnknowException *)in_RDI);
  return;
}

Assistant:

class CURLPPAPI CallbackException : public CallbackExceptionBase
	{

	public: 

		typedef CallbackException<ExceptionType> _CE;

		CallbackException(const ExceptionType & e) 
			: mException(e)
		{}

		virtual void throwMe() 
		{
			throw mException;
		}

		virtual _CE * clone() 
		{
			return new _CE(*this);
		}

	private:

		ExceptionType mException;

	}